

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# B3DImporter.cpp
# Opt level: O2

void __thiscall Assimp::B3DImporter::ReadKEYS(B3DImporter *this,aiNodeAnim *nodeAnim)

{
  uint uVar1;
  int iVar2;
  aiVectorKey *paVar3;
  aiQuatKey *paVar4;
  double dVar5;
  aiVector3D aVar6;
  undefined1 local_a0 [8];
  aiQuaternion local_98;
  vector<aiQuatKey,_std::allocator<aiQuatKey>_> rot;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> scale;
  vector<aiVectorKey,_std::allocator<aiVectorKey>_> trans;
  
  trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar1 = ReadInt(this);
  while ((this->_stack).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish[-1] != this->_pos) {
    iVar2 = ReadInt(this);
    dVar5 = (double)iVar2;
    if ((uVar1 & 1) != 0) {
      aVar6 = ReadVec3(this);
      local_98.w = aVar6.x;
      local_98.x = aVar6.y;
      local_98.y = aVar6.z;
      local_a0 = (undefined1  [8])dVar5;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::emplace_back<aiVectorKey>
                (&trans,(aiVectorKey *)local_a0);
    }
    if ((uVar1 & 2) != 0) {
      aVar6 = ReadVec3(this);
      local_98.w = aVar6.x;
      local_98.x = aVar6.y;
      local_98.y = aVar6.z;
      local_a0 = (undefined1  [8])dVar5;
      std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::emplace_back<aiVectorKey>
                (&scale,(aiVectorKey *)local_a0);
    }
    if ((uVar1 & 4) != 0) {
      local_98 = ReadQuat(this);
      local_a0 = (undefined1  [8])dVar5;
      std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::emplace_back<aiQuatKey>
                (&rot,(aiQuatKey *)local_a0);
    }
  }
  if ((uVar1 & 1) != 0) {
    nodeAnim->mNumPositionKeys =
         (uint)(((long)trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
    paVar3 = to_array<aiVectorKey>(this,&trans);
    nodeAnim->mPositionKeys = paVar3;
  }
  if ((uVar1 & 2) != 0) {
    nodeAnim->mNumScalingKeys =
         (uint)(((long)scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
    paVar3 = to_array<aiVectorKey>(this,&scale);
    nodeAnim->mScalingKeys = paVar3;
  }
  if ((uVar1 & 4) != 0) {
    nodeAnim->mNumRotationKeys =
         (uint)(((long)rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                      super__Vector_impl_data._M_start) / 0x18);
    paVar4 = to_array<aiQuatKey>(this,&rot);
    nodeAnim->mRotationKeys = paVar4;
  }
  std::_Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>::~_Vector_base
            (&rot.super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>);
  std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
            (&scale.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
  std::_Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>::~_Vector_base
            (&trans.super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>);
  return;
}

Assistant:

void B3DImporter::ReadKEYS( aiNodeAnim *nodeAnim ){
    vector<aiVectorKey> trans,scale;
    vector<aiQuatKey> rot;
    int flags=ReadInt();
    while( ChunkSize() ){
        int frame=ReadInt();
        if( flags & 1 ){
            trans.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 2 ){
            scale.push_back( aiVectorKey( frame,ReadVec3() ) );
        }
        if( flags & 4 ){
            rot.push_back( aiQuatKey( frame,ReadQuat() ) );
        }
    }

    if( flags & 1 ){
        nodeAnim->mNumPositionKeys=static_cast<unsigned int>(trans.size());
        nodeAnim->mPositionKeys=to_array( trans );
    }

    if( flags & 2 ){
        nodeAnim->mNumScalingKeys=static_cast<unsigned int>(scale.size());
        nodeAnim->mScalingKeys=to_array( scale );
    }

    if( flags & 4 ){
        nodeAnim->mNumRotationKeys=static_cast<unsigned int>(rot.size());
        nodeAnim->mRotationKeys=to_array( rot );
    }
}